

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddCustomCommandCommand::Clone(cmAddCustomCommandCommand *this)

{
  cmCommand *this_00;
  cmAddCustomCommandCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddCustomCommandCommand((cmAddCustomCommandCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmAddCustomCommandCommand; }